

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O0

ares_status_t ares_dns_parse_rr_a(ares_buf_t *buf,ares_dns_rr_t *rr,size_t rdlength)

{
  in_addr local_2c;
  ares_status_t status;
  in_addr addr;
  size_t rdlength_local;
  ares_dns_rr_t *rr_local;
  ares_buf_t *buf_local;
  
  _status = rdlength;
  buf_local._4_4_ = ares_buf_fetch_bytes(buf,(uchar *)&local_2c,4);
  if (buf_local._4_4_ == ARES_SUCCESS) {
    buf_local._4_4_ = ares_dns_rr_set_addr(rr,ARES_RR_A_ADDR,&local_2c);
  }
  return buf_local._4_4_;
}

Assistant:

static ares_status_t ares_dns_parse_rr_a(ares_buf_t *buf, ares_dns_rr_t *rr,
                                         size_t rdlength)
{
  struct in_addr addr;
  ares_status_t  status;

  (void)rdlength; /* Not needed */

  status = ares_buf_fetch_bytes(buf, (unsigned char *)&addr, sizeof(addr));
  if (status != ARES_SUCCESS) {
    return status;
  }

  return ares_dns_rr_set_addr(rr, ARES_RR_A_ADDR, &addr);
}